

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

LineInterpolationRange __thiscall
tcu::anon_unknown_3::calcLineInterpolationWeights
          (anon_unknown_3 *this,Vec2 *pa,float wa,Vec2 *pb,float wb,Vec2 *pr)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float minDivisor;
  float fVar7;
  Vec2 VVar8;
  LineInterpolationRange LVar9;
  float perspectiveDivisorMin;
  float perspectiveDivisorMax;
  float perspectiveInvTMin;
  float perspectiveInvTMax;
  float perspectiveTMin;
  float perspectiveTMax;
  float tMin;
  float tMax;
  float divisorMin;
  float divisorMax;
  float local_60;
  float local_5c;
  float divisor;
  float dividendMin;
  float dividendMax;
  Vector<float,_2> local_4c;
  float local_44;
  undefined4 local_40;
  float dividend;
  int divError;
  int roundError;
  Vec2 *pr_local;
  Vec2 *pVStack_28;
  float wb_local;
  Vec2 *pb_local;
  Vec2 *pVStack_18;
  float wa_local;
  Vec2 *pa_local;
  LineInterpolationRange *returnValue;
  
  dividend = 1.4013e-45;
  local_40 = 3;
  _divError = pr;
  pr_local._4_4_ = wb;
  pVStack_28 = pb;
  pb_local._4_4_ = wa;
  pVStack_18 = pa;
  pa_local = (Vec2 *)this;
  tcu::operator-((tcu *)&local_4c,pr,pa);
  tcu::operator-((tcu *)&dividendMin,pVStack_28,pVStack_18);
  local_44 = dot<float,2>(&local_4c,(Vector<float,_2> *)&dividendMin);
  divisor = getMaxValueWithinError(local_44,1);
  local_5c = getMinValueWithinError(local_44,1);
  tcu::operator-((tcu *)&divisorMin,pVStack_28,pVStack_18);
  local_60 = lengthSquared<float,2>((Vector<float,_2> *)&divisorMin);
  fVar2 = getMaxValueWithinError(local_60,1);
  fVar3 = getMinValueWithinError(local_60,1);
  fVar4 = maximalRangeDivision(local_5c,divisor,fVar3,fVar2);
  fVar4 = getMaxValueWithinError(fVar4,3);
  fVar2 = minimalRangeDivision(local_5c,divisor,fVar3,fVar2);
  fVar2 = getMinValueWithinError(fVar2,3);
  fVar3 = maximalRangeDivision(fVar2,fVar4,pr_local._4_4_,pr_local._4_4_);
  fVar3 = getMaxValueWithinError(fVar3,3);
  fVar5 = minimalRangeDivision(fVar2,fVar4,pr_local._4_4_,pr_local._4_4_);
  fVar5 = getMinValueWithinError(fVar5,3);
  fVar6 = maximalRangeDivision(1.0 - fVar4,1.0 - fVar2,pb_local._4_4_,pb_local._4_4_);
  fVar6 = getMaxValueWithinError(fVar6,3);
  fVar2 = minimalRangeDivision(1.0 - fVar4,1.0 - fVar2,pb_local._4_4_,pb_local._4_4_);
  fVar2 = getMinValueWithinError(fVar2,3);
  fVar4 = getMaxValueWithinError(fVar3 + fVar6,1);
  minDivisor = getMinValueWithinError(fVar5 + fVar2,1);
  LineInterpolationRange::LineInterpolationRange((LineInterpolationRange *)this);
  fVar7 = maximalRangeDivision(fVar2,fVar6,minDivisor,fVar4);
  fVar7 = getMaxValueWithinError(fVar7,3);
  pfVar1 = Vector<float,_2>::x((Vector<float,_2> *)this);
  *pfVar1 = fVar7;
  fVar7 = maximalRangeDivision(fVar5,fVar3,minDivisor,fVar4);
  fVar7 = getMaxValueWithinError(fVar7,3);
  pfVar1 = Vector<float,_2>::y((Vector<float,_2> *)this);
  *pfVar1 = fVar7;
  fVar2 = minimalRangeDivision(fVar2,fVar6,minDivisor,fVar4);
  fVar2 = getMinValueWithinError(fVar2,3);
  pfVar1 = Vector<float,_2>::x((Vector<float,_2> *)(this + 8));
  *pfVar1 = fVar2;
  VVar8.m_data[1] = 0.0;
  VVar8.m_data[0] = fVar3;
  fVar2 = minimalRangeDivision(fVar5,fVar3,minDivisor,fVar4);
  LVar9.max.m_data[0] = getMinValueWithinError(fVar2,3);
  pfVar1 = Vector<float,_2>::y((Vector<float,_2> *)(this + 8));
  LVar9.max.m_data[1] = 0.0;
  *pfVar1 = LVar9.max.m_data[0];
  LVar9.min.m_data[0] = VVar8.m_data[0];
  LVar9.min.m_data[1] = VVar8.m_data[1];
  return LVar9;
}

Assistant:

LineInterpolationRange calcLineInterpolationWeights (const tcu::Vec2& pa, float wa, const tcu::Vec2& pb, float wb, const tcu::Vec2& pr)
{
	const int roundError	= 1;
	const int divError		= 3;

	// calc weights:
	//			(1-t) / wa					t / wb
	//		-------------------	,	-------------------
	//		(1-t) / wa + t / wb		(1-t) / wa + t / wb

	// Allow 1 ULP
	const float		dividend	= tcu::dot(pr - pa, pb - pa);
	const float		dividendMax	= getMaxValueWithinError(dividend, 1);
	const float		dividendMin	= getMinValueWithinError(dividend, 1);
	DE_ASSERT(dividendMin <= dividendMax);

	// Assuming lengthSquared will not be implemented as sqrt(x)^2, allow 1 ULP
	const float		divisor		= tcu::lengthSquared(pb - pa);
	const float		divisorMax	= getMaxValueWithinError(divisor, 1);
	const float		divisorMin	= getMinValueWithinError(divisor, 1);
	DE_ASSERT(divisorMin <= divisorMax);

	// Allow 3 ULP precision for division
	const float		tMax		= getMaxValueWithinError(maximalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	const float		tMin		= getMinValueWithinError(minimalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	DE_ASSERT(tMin <= tMax);

	const float		perspectiveTMax			= getMaxValueWithinError(maximalRangeDivision(tMin, tMax, wb, wb), divError);
	const float		perspectiveTMin			= getMinValueWithinError(minimalRangeDivision(tMin, tMax, wb, wb), divError);
	DE_ASSERT(perspectiveTMin <= perspectiveTMax);

	const float		perspectiveInvTMax		= getMaxValueWithinError(maximalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	const float		perspectiveInvTMin		= getMinValueWithinError(minimalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	DE_ASSERT(perspectiveInvTMin <= perspectiveInvTMax);

	const float		perspectiveDivisorMax	= getMaxValueWithinError(perspectiveTMax + perspectiveInvTMax, roundError);
	const float		perspectiveDivisorMin	= getMinValueWithinError(perspectiveTMin + perspectiveInvTMin, roundError);
	DE_ASSERT(perspectiveDivisorMin <= perspectiveDivisorMax);

	LineInterpolationRange returnValue;
	returnValue.max.x() = getMaxValueWithinError(maximalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.max.y() = getMaxValueWithinError(maximalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.x() = getMinValueWithinError(minimalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.y() = getMinValueWithinError(minimalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);

	DE_ASSERT(returnValue.min.x() <= returnValue.max.x());
	DE_ASSERT(returnValue.min.y() <= returnValue.max.y());

	return returnValue;
}